

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

ByteArray *
ot::commissioner::CommissionerImpl::GetActiveOperationalDatasetTlvs
          (ByteArray *__return_storage_ptr__,uint16_t aDatasetFlags)

{
  uint16_t aDatasetFlags_local;
  ByteArray *tlvTypes;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  if ((aDatasetFlags & 0x8000) != 0) {
    EncodeTlvType(__return_storage_ptr__,kActiveTimestamp);
  }
  if ((aDatasetFlags & 0x4000) != 0) {
    EncodeTlvType(__return_storage_ptr__,kChannel);
  }
  if ((aDatasetFlags & 0x2000) != 0) {
    EncodeTlvType(__return_storage_ptr__,kChannelMask);
  }
  if ((aDatasetFlags & 0x1000) != 0) {
    EncodeTlvType(__return_storage_ptr__,kExtendedPanId);
  }
  if ((aDatasetFlags & 0x800) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagNetworkData);
  }
  if ((aDatasetFlags & 0x400) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagRoute64);
  }
  if ((aDatasetFlags & 0x200) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagTimeout);
  }
  if ((aDatasetFlags & 0x100) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagMacAddress);
  }
  if ((aDatasetFlags & 0x80) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagConnectivity);
  }
  if ((aDatasetFlags & 0x40) != 0) {
    EncodeTlvType(__return_storage_ptr__,kSecurityPolicy);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray CommissionerImpl::GetActiveOperationalDatasetTlvs(uint16_t aDatasetFlags)
{
    ByteArray tlvTypes;

    if (aDatasetFlags & ActiveOperationalDataset::kActiveTimestampBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kActiveTimestamp);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kChannelBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kChannel);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kChannelMaskBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kChannelMask);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kExtendedPanIdBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kExtendedPanId);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kMeshLocalPrefixBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkMeshLocalPrefix);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kNetworkMasterKeyBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkMasterKey);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kNetworkNameBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkName);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kPanIdBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kPanId);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kPSKcBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kPSKc);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kSecurityPolicyBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kSecurityPolicy);
    }

    return tlvTypes;
}